

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

void __thiscall
google::protobuf::TextFormat::Printer::DebugStringFieldValuePrinter::PrintMessageStart
          (DebugStringFieldValuePrinter *this,Message *param_1,int param_2,int param_3,
          bool single_line_mode,BaseTextGenerator *generator)

{
  StringPiece local_78;
  StringPiece local_68;
  StringPiece local_58;
  StringPiece local_48;
  BaseTextGenerator *local_38;
  TextGenerator *text_generator;
  BaseTextGenerator *generator_local;
  int local_20;
  int iStack_1c;
  bool single_line_mode_local;
  int param_3_local;
  int param_2_local;
  Message *param_1_local;
  DebugStringFieldValuePrinter *this_local;
  
  local_38 = generator;
  text_generator = (TextGenerator *)generator;
  generator_local._7_1_ = single_line_mode;
  local_20 = param_3;
  iStack_1c = param_2;
  _param_3_local = param_1;
  param_1_local = (Message *)this;
  if (single_line_mode) {
    stringpiece_internal::StringPiece::StringPiece(&local_48," ");
    stringpiece_internal::StringPiece::StringPiece(&local_58,"{ ");
    TextGenerator::PrintMaybeWithMarker((TextGenerator *)generator,local_48,local_58);
  }
  else {
    stringpiece_internal::StringPiece::StringPiece(&local_68," ");
    stringpiece_internal::StringPiece::StringPiece(&local_78,"{\n");
    TextGenerator::PrintMaybeWithMarker((TextGenerator *)generator,local_68,local_78);
  }
  return;
}

Assistant:

void PrintMessageStart(const Message& /*message*/, int /*field_index*/,
                         int /*field_count*/, bool single_line_mode,
                         BaseTextGenerator* generator) const override {
    // This is safe as only TextGenerator is used with
    // DebugStringFieldValuePrinter.
    TextGenerator* text_generator = static_cast<TextGenerator*>(generator);
    if (single_line_mode) {
      text_generator->PrintMaybeWithMarker(" ", "{ ");
    } else {
      text_generator->PrintMaybeWithMarker(" ", "{\n");
    }
  }